

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_parser.tab.hh
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
MC::MC_Parser::value_type::emplace<std::__cxx11::string,std::__cxx11::string_const&>
          (value_type *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u)

{
  pointer pcVar1;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    this->yytypeid_ = (type_info *)&std::__cxx11::string::typeinfo;
    *(undefined1 **)&this->field_0 = (undefined1 *)((long)&this->field_0 + 0x10);
    pcVar1 = (u->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + u->_M_string_length);
    return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  }
  __assert_fail("!yytypeid_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Cjkkkk[P]minisql/build_O3/mc_parser.tab.hh"
                ,0x109,
                "T &MC::MC_Parser::value_type::emplace(U &&...) [T = std::basic_string<char>, U = <const std::basic_string<char> &>]"
               );
}

Assistant:

T&
    emplace (U&&... u)
    {
      YY_ASSERT (!yytypeid_);
      YY_ASSERT (sizeof (T) <= size);
      yytypeid_ = & typeid (T);
      return *new (yyas_<T> ()) T (std::forward <U>(u)...);
    }